

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bimap.hpp
# Opt level: O0

void __thiscall
pstore::broker::bimap<int,_char,_std::less<int>,_std::less<char>_>::set
          (bimap<int,_char,_std::less<int>,_std::less<char>_> *this,int *left,char *right)

{
  char cVar1;
  pointer ppVar2;
  size_type sVar3;
  size_type sVar4;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_char>_>,_bool> pVar5;
  pointer local_50;
  _Rb_tree_iterator<std::pair<const_int,_char>_> *local_48;
  _Rb_tree_iterator<std::pair<const_int,_char>_> *it;
  undefined1 local_38;
  _Rb_tree_iterator<std::pair<const_int,_char>_> local_30;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_char>_>,_bool> emplace_res;
  char *right_local;
  int *left_local;
  bimap<int,_char,_std::less<int>,_std::less<char>_> *this_local;
  
  emplace_res._8_8_ = right;
  pVar5 = std::map<int,char,std::less<int>,std::allocator<std::pair<int_const,char>>>::
          emplace<int_const&,char_const&>
                    ((map<int,char,std::less<int>,std::allocator<std::pair<int_const,char>>> *)this,
                     left,right);
  it = (_Rb_tree_iterator<std::pair<const_int,_char>_> *)pVar5.first._M_node;
  local_38 = pVar5.second;
  local_48 = &local_30;
  local_30._M_node = (_Base_ptr)it;
  emplace_res.first._M_node._0_1_ = local_38;
  if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_int,_char>_>::operator->(local_48);
    local_50 = std::_Rb_tree_iterator<std::pair<const_int,_char>_>::operator->(local_48);
    std::map<char,int_const*,std::less<char>,std::allocator<std::pair<char_const,int_const*>>>::
    emplace<char&,int_const*>
              ((map<char,int_const*,std::less<char>,std::allocator<std::pair<char_const,int_const*>>>
                *)&this->right_,&ppVar2->second,(int **)&local_50);
  }
  sVar3 = std::map<int,_char,_std::less<int>,_std::allocator<std::pair<const_int,_char>_>_>::size
                    (&this->left_);
  sVar4 = std::
          map<char,_const_int_*,_std::less<char>,_std::allocator<std::pair<const_char,_const_int_*>_>_>
          ::size(&this->right_);
  if (sVar3 == sVar4) {
    cVar1 = *(char *)emplace_res._8_8_;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_int,_char>_>::operator->(local_48);
    ppVar2->second = cVar1;
    return;
  }
  assert_failed("left_.size () == right_.size ()",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/broker/bimap.hpp"
                ,0x86);
}

Assistant:

void bimap<L, R, Lcmp, Rcmp>::set (L const & left, R const & right) {
#ifdef PSTORE_STD_MAP_HAS_INSERT_OR_ASSIGN
            auto emplace_res = left_.insert_or_assign (left, right);
#else
            auto emplace_res = left_.emplace (left, right);
#endif // PSTORE_STD_MAP_HAS_INSERT_OR_ASSIGN

            auto & it = emplace_res.first;
            if (emplace_res.second) {
                // We inserted a new key-value pair. Update right_ to match.
                right_.emplace (it->second, &it->first);
            }
            PSTORE_ASSERT (left_.size () == right_.size ());

#ifndef PSTORE_STD_MAP_HAS_INSERT_OR_ASSIGN
            it->second = right;
#endif // PSTORE_STD_MAP_HAS_INSERT_OR_ASSIGN
        }